

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O1

ssize_t __thiscall
chatra::emb::io::ReadStandardFile::write(ReadStandardFile *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  *puVar1 = &PTR__NativeException_00246918;
  __cxa_throw(puVar1,&UnsupportedOperationException::typeinfo,NativeException::~NativeException);
}

Assistant:

size_t write(const uint8_t* src, size_t length) override {
		(void)src;
		(void)length;
		throw UnsupportedOperationException();
	}